

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

uint32 re2::Engines(void)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  StringPiece SVar4;
  StringPiece s;
  StringPiece local_360;
  LogMessage local_350;
  Engine local_1d0 [2];
  Engine i_1;
  LogMessage local_1c0;
  char *local_40;
  int local_38;
  char *local_30;
  int local_28;
  StringPiece local_20;
  Engine local_10;
  uint32 local_c;
  Engine i;
  
  if (Engines::did_parse) {
    local_c = Engines::cached_engines;
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_10 = kEngineBacktrack;
      while ((int)local_10 < 10) {
        StringPiece::StringPiece(&local_20,(string *)FLAGS_regexp_engines_abi_cxx11_);
        SVar4 = EngineName(local_10);
        local_40 = SVar4.ptr_;
        local_38 = SVar4.length_;
        s._12_4_ = 0;
        s.ptr_ = (char *)SUB128(SVar4._0_12_,0);
        s.length_ = SUB124(SVar4._0_12_,8);
        local_30 = local_40;
        local_28 = local_38;
        bVar1 = StringPiece::contains(&local_20,s);
        if (bVar1) {
          Engines::cached_engines = 1 << ((byte)local_10 & 0x1f) | Engines::cached_engines;
        }
        operator++(&local_10,0);
      }
    }
    else {
      Engines::cached_engines = 0xffffffff;
    }
    if (Engines::cached_engines == 0) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                 ,0x43,0);
      poVar3 = LogMessage::stream(&local_1c0);
      std::operator<<(poVar3,"Warning: no engines enabled.");
      LogMessage::~LogMessage(&local_1c0);
    }
    Engines::cached_engines = Engines::cached_engines & 0xfffffdff;
    local_1d0[0] = kEngineBacktrack;
    while ((int)local_1d0[0] < 10) {
      if ((Engines::cached_engines & 1 << ((byte)local_1d0[0] & 0x1f)) != 0) {
        LogMessage::LogMessage
                  (&local_350,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x48,0);
        poVar3 = LogMessage::stream(&local_350);
        SVar4 = EngineName(local_1d0[0]);
        local_360.ptr_ = SVar4.ptr_;
        local_360.length_ = SVar4.length_;
        poVar3 = operator<<(poVar3,&local_360);
        std::operator<<(poVar3," enabled");
        LogMessage::~LogMessage(&local_350);
      }
      operator++(local_1d0,0);
    }
    Engines::did_parse = true;
    local_c = Engines::cached_engines;
  }
  Engines::cached_engines = local_c;
  return local_c;
}

Assistant:

static uint32 Engines() {
  static bool did_parse = false;
  static uint32 cached_engines = 0;

  if (did_parse)
    return cached_engines;

  if (FLAGS_regexp_engines.empty()) {
    cached_engines = ~0;
  } else {
    for (Engine i = static_cast<Engine>(0); i < kEngineMax; i++)
      if (StringPiece(FLAGS_regexp_engines).contains(EngineName(i)))
        cached_engines |= 1<<i;
  }

  if (cached_engines == 0)
    LOG(INFO) << "Warning: no engines enabled.";
  if (!UsingPCRE)
    cached_engines &= ~(1<<kEnginePCRE);
  for (Engine i = static_cast<Engine>(0); i < kEngineMax; i++) {
    if (cached_engines & (1<<i))
      LOG(INFO) << EngineName(i) << " enabled";
  }

  did_parse = true;
  return cached_engines;
}